

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-linux.c
# Opt level: O0

GPtrArray * enumerate_drive_bins(GError **error)

{
  int iVar1;
  GQuark GVar2;
  char *pcVar3;
  GPtrArray *pGVar4;
  undefined8 uVar5;
  char *full_rbin_path;
  gsize i;
  char *sid;
  GPtrArray *result;
  GPtrArray *mnt_pts;
  GError **error_local;
  
  pcVar3 = _get_user_sid(error);
  if (pcVar3 == (char *)0x0) {
    error_local = (GError **)0x0;
  }
  else {
    pGVar4 = _probe_mounts(error);
    if (pGVar4 == (GPtrArray *)0x0) {
      error_local = (GError **)0x0;
    }
    else if (pGVar4->len == 0) {
      g_ptr_array_free(pGVar4,1);
      error_local = (GError **)0x0;
    }
    else {
      sid = (char *)g_ptr_array_new_with_free_func(g_free);
      for (full_rbin_path = (char *)0x0; full_rbin_path < (char *)(ulong)pGVar4->len;
          full_rbin_path = full_rbin_path + 1) {
        uVar5 = g_build_filename(pGVar4->pdata[(long)full_rbin_path],"$Recycle.bin",pcVar3,0);
        iVar1 = g_file_test(uVar5,0x10);
        if (iVar1 == 0) {
          g_free(uVar5);
        }
        else {
          g_ptr_array_add(sid,uVar5);
        }
      }
      g_ptr_array_free(pGVar4,1);
      if (*(int *)(sid + 8) == 0) {
        GVar2 = rifiuti_misc_error_quark();
        g_set_error_literal(error,GVar2,1,"No recycle bin found on system");
        g_ptr_array_free(sid,1);
        sid = (char *)0x0;
      }
      error_local = (GError **)sid;
    }
  }
  return (GPtrArray *)error_local;
}

Assistant:

GPtrArray *
enumerate_drive_bins   (GError   **error)
{
    GPtrArray *mnt_pts, *result;
    char *sid;

    if (NULL == (sid = _get_user_sid (error)))
        return NULL;

    mnt_pts = _probe_mounts (error);
    if (mnt_pts == NULL)
        return NULL;
    if (mnt_pts->len == 0)
    {
        g_ptr_array_free (mnt_pts, TRUE);
        return NULL;
    }

    result = g_ptr_array_new_with_free_func ((GDestroyNotify) g_free);

    for (gsize i = 0; i < mnt_pts->len; i++)
    {
        char *full_rbin_path = g_build_filename (
            (char *) (mnt_pts->pdata[i]), "$Recycle.bin", sid, NULL);
        if (g_file_test (full_rbin_path, G_FILE_TEST_EXISTS))
            g_ptr_array_add (result, full_rbin_path);
        else
            g_free (full_rbin_path);
    }
    g_ptr_array_free (mnt_pts, TRUE);

    if (result->len == 0) {
        g_set_error_literal (error, R2_MISC_ERROR,
            R2_MISC_ERROR_ENUMERATE_MNT,
            "No recycle bin found on system");
        g_ptr_array_free (result, TRUE);
        result = NULL;
    }
    return result;
}